

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError ValidateForSingleImage(WebPMux *mux)

{
  int iVar1;
  int iVar2;
  int num_frames;
  int num_images;
  WebPChunkId in_stack_fffffffffffffffc;
  WebPMuxError WVar3;
  
  iVar1 = MuxImageCount(_num_frames,in_stack_fffffffffffffffc);
  iVar2 = MuxImageCount(_num_frames,in_stack_fffffffffffffffc);
  if (iVar1 == 0) {
    WVar3 = WEBP_MUX_NOT_FOUND;
  }
  else if ((iVar1 == 1) && (iVar2 == 0)) {
    WVar3 = WEBP_MUX_OK;
  }
  else {
    WVar3 = WEBP_MUX_INVALID_ARGUMENT;
  }
  return WVar3;
}

Assistant:

static WebPMuxError ValidateForSingleImage(const WebPMux* const mux) {
  const int num_images = MuxImageCount(mux->images_, WEBP_CHUNK_IMAGE);
  const int num_frames = MuxImageCount(mux->images_, WEBP_CHUNK_ANMF);

  if (num_images == 0) {
    // No images in mux.
    return WEBP_MUX_NOT_FOUND;
  } else if (num_images == 1 && num_frames == 0) {
    // Valid case (single image).
    return WEBP_MUX_OK;
  } else {
    // Frame case OR an invalid mux.
    return WEBP_MUX_INVALID_ARGUMENT;
  }
}